

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.h
# Opt level: O1

void __thiscall
GrcErrorItem::GrcErrorItem
          (GrcErrorItem *this,bool fFatal,int nID,GrpLineAndFile *lnf,string *staMsg,
          GdlObject *pgdlObj)

{
  pointer pcVar1;
  
  this->m_nID = nID;
  this->m_pgdlObject = pgdlObj;
  (this->m_staMsg)._M_dataplus._M_p = (pointer)&(this->m_staMsg).field_2;
  pcVar1 = (staMsg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_staMsg,pcVar1,pcVar1 + staMsg->_M_string_length);
  this->m_fFatal = fFatal;
  this->m_fMsgIncludesFatality = false;
  GrpLineAndFile::GrpLineAndFile(&this->m_lnf,lnf);
  return;
}

Assistant:

GrcErrorItem(bool fFatal, int nID, GrpLineAndFile & lnf, std::string staMsg, GdlObject * pgdlObj)
		:	m_nID(nID),
			m_pgdlObject(pgdlObj),
			m_staMsg(staMsg),
			m_fFatal(fFatal),
			m_fMsgIncludesFatality(false),
			m_lnf(lnf)
	{
	}